

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O0

void OPSG_Write(void *chip,UINT8 regNum,UINT8 data)

{
  huc6280_state *info;
  UINT8 data_local;
  UINT8 regNum_local;
  void *chip_local;
  
  write_reg((huc6280_state *)chip,regNum,data);
  return;
}

Assistant:

static void
OPSG_Write(
	void*		chip,
	UINT8		regNum,
	UINT8		data)
{
	huc6280_state* info = (huc6280_state*)chip;
	
#ifdef ENABLE_QUEUE
	//v1.10更新。キュー処理をここに統合して高速化。
	//Kitao更新。clockは考慮せずにシンプルにして高速化した。
	if (((_QueueWriteIndex + 1) & (APUQUEUE_SIZE-1)) == _QueueReadIndex)
	{
		//PRINTF("PSG Queue Over!"); // キューが満タン
		return;
	}
	_Queue[_QueueWriteIndex].reg   = (Uint8)(regNum & 15);
	_Queue[_QueueWriteIndex].data  = data;
	_QueueWriteIndex++; //Kitao更新
	_QueueWriteIndex &= APUQUEUE_SIZE-1; //Kitao更新
#else
	write_reg(info, regNum, data);
#endif
}